

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<capnp::Void_const&>(String *__return_storage_ptr__,kj *this,Void *params)

{
  Void *value;
  ArrayPtr<const_char> local_28;
  kj *local_18;
  Void *params_local;
  
  local_18 = this;
  params_local = (Void *)__return_storage_ptr__;
  value = fwd<capnp::Void_const&>((Void *)this);
  local_28 = (ArrayPtr<const_char>)toCharSequence<capnp::Void_const&>(value);
  _::concat<kj::StringPtr>(__return_storage_ptr__,(StringPtr *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}